

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

uint __thiscall
crnlib::symbol_codec::encode_transmit_static_huffman_data_model
          (symbol_codec *this,static_huffman_data_model *model,bool simulate,
          static_huffman_data_model *pDeltaModel)

{
  byte bVar1;
  ushort uVar2;
  short sVar3;
  symbol_codec *this_00;
  int iVar4;
  uchar *puVar5;
  uint uVar6;
  undefined7 in_register_00000011;
  unsigned_short uVar7;
  long lVar8;
  ulong uVar9;
  uint num_bits;
  long lVar10;
  ulong uVar11;
  byte bVar12;
  uint uVar13;
  uint i;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  vector<unsigned_short> codes;
  vector<unsigned_char> delta_code_sizes;
  static_huffman_data_model dm;
  uint16 hist [21];
  vector<unsigned_short> local_e8;
  undefined4 local_cc;
  ulong local_c8;
  symbol_codec *local_c0;
  elemental_vector local_b8;
  byte *local_a8;
  static_huffman_data_model local_a0;
  short local_68 [28];
  
  local_cc = (undefined4)CONCAT71(in_register_00000011,simulate);
  uVar15 = model->m_total_syms;
  uVar9 = (ulong)uVar15;
  puVar5 = (model->m_code_sizes).m_p;
  lVar8 = -1;
  lVar10 = 0;
  do {
    puVar5 = puVar5 + -1;
    local_c0 = this;
    if (uVar9 + lVar10 == 0) {
      if (simulate) {
        return 0xe;
      }
      record_put_bits(this,0,0xe);
      return 0xe;
    }
    lVar8 = lVar8 + 1;
    lVar10 = lVar10 + -1;
  } while (puVar5[uVar9] == '\0');
  local_e8.m_p = (unsigned_short *)0x0;
  local_e8.m_size = 0;
  local_e8.m_capacity = 0;
  vector<unsigned_short>::reserve(&local_e8,uVar15);
  uVar11 = uVar9 - lVar8;
  local_a8 = (model->m_code_sizes).m_p;
  local_b8.m_p = (byte *)0x0;
  local_b8.m_size = 0;
  local_b8.m_capacity = 0;
  if ((pDeltaModel != (static_huffman_data_model *)0x0) && (pDeltaModel->m_total_syms != 0)) {
    uVar17 = 0;
    uVar6 = (uint)uVar11;
    if ((pDeltaModel->m_code_sizes).m_size < uVar6) goto LAB_0019af4b;
    elemental_vector::increase_capacity
              (&local_b8,uVar6,uVar9 + lVar10 == 0,1,(object_mover)0x0,false);
    uVar9 = 0;
    memset((byte *)((long)local_b8.m_p + (local_b8._8_8_ & 0xffffffff)),0,
           (ulong)((uVar15 - local_b8.m_size) - (int)lVar8));
    local_b8.m_size = uVar6;
    do {
      uVar6 = (uint)(model->m_code_sizes).m_p[uVar9] - (uint)(pDeltaModel->m_code_sizes).m_p[uVar9];
      uVar15 = (uint)(byte)((char)uVar6 + 0x11);
      if (-1 < (int)uVar6) {
        uVar15 = uVar6;
      }
      *(byte *)((long)local_b8.m_p + uVar9) = (byte)uVar15;
      uVar9 = uVar9 + 1;
    } while (uVar9 < (uVar11 & 0xffffffff));
    local_a8 = (byte *)local_b8.m_p;
  }
  uVar15 = 0xffffffff;
  uVar14 = 0;
  uVar6 = 0;
  uVar13 = 0;
  local_c8 = uVar11;
  do {
    uVar16 = 0xff;
    if (uVar14 < (uint)local_c8) {
      bVar12 = *local_a8;
      local_a8 = local_a8 + 1;
      if (bVar12 != 0) {
        uVar16 = (uint)bVar12;
        goto LAB_0019aa49;
      }
      if (uVar13 != 0) {
        if (uVar13 < 3) {
          do {
            if (local_e8.m_capacity <= local_e8.m_size) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)&local_e8,local_e8.m_size + 1,true,2,(object_mover)0x0,
                         false);
            }
            uVar13 = uVar13 - 1;
            local_e8.m_p[local_e8.m_size] = (unsigned_short)uVar15;
            local_e8.m_size = local_e8.m_size + 1;
          } while (uVar13 != 0);
        }
        else {
          sVar3 = (short)uVar13 * 0x100;
          if (uVar13 < 7) {
            uVar7 = sVar3 - 0x2ed;
          }
          else {
            uVar7 = sVar3 - 0x6ec;
          }
          if (local_e8.m_capacity <= local_e8.m_size) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&local_e8,local_e8.m_size + 1,true,2,(object_mover)0x0,
                       false);
          }
          local_e8.m_p[local_e8.m_size] = uVar7;
          local_e8.m_size = local_e8.m_size + 1;
        }
      }
      uVar6 = uVar6 + 1;
      if (uVar6 == 0x8a) {
        uVar16 = 0x7f12;
        uVar15 = (uint)bVar12;
        if (local_e8.m_capacity <= local_e8.m_size) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_e8,local_e8.m_size + 1,true,2,(object_mover)0x0,
                     false);
        }
        goto LAB_0019ac8d;
      }
      uVar13 = 0;
      uVar15 = (uint)bVar12;
    }
    else {
LAB_0019aa49:
      if (uVar6 != 0) {
        if (uVar6 < 3) {
          do {
            if (local_e8.m_capacity <= local_e8.m_size) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)&local_e8,local_e8.m_size + 1,true,2,(object_mover)0x0,
                         false);
            }
            uVar6 = uVar6 - 1;
            local_e8.m_p[local_e8.m_size] = 0;
            local_e8.m_size = local_e8.m_size + 1;
          } while (uVar6 != 0);
        }
        else {
          sVar3 = (short)uVar6 * 0x100;
          if (uVar6 < 0xb) {
            uVar7 = sVar3 - 0x2ef;
          }
          else {
            uVar7 = sVar3 - 0xaee;
          }
          if (local_e8.m_capacity <= local_e8.m_size) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&local_e8,local_e8.m_size + 1,true,2,(object_mover)0x0,
                       false);
          }
          local_e8.m_p[local_e8.m_size] = uVar7;
          local_e8.m_size = local_e8.m_size + 1;
        }
      }
      if (uVar16 == uVar15) {
        uVar13 = uVar13 + 1;
        if (uVar13 != 0x46) {
          uVar6 = 0;
          goto LAB_0019aca1;
        }
        uVar16 = 0x3f14;
        if (local_e8.m_capacity <= local_e8.m_size) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_e8,local_e8.m_size + 1,true,2,(object_mover)0x0,
                     false);
        }
LAB_0019ac8d:
        local_e8.m_p[local_e8.m_size] = (unsigned_short)uVar16;
        local_e8.m_size = local_e8.m_size + 1;
      }
      else {
        if (uVar13 != 0) {
          if (uVar13 < 3) {
            do {
              if (local_e8.m_capacity <= local_e8.m_size) {
                elemental_vector::increase_capacity
                          ((elemental_vector *)&local_e8,local_e8.m_size + 1,true,2,
                           (object_mover)0x0,false);
              }
              uVar13 = uVar13 - 1;
              local_e8.m_p[local_e8.m_size] = (unsigned_short)uVar15;
              local_e8.m_size = local_e8.m_size + 1;
            } while (uVar13 != 0);
          }
          else {
            sVar3 = (short)uVar13 * 0x100;
            if (uVar13 < 7) {
              uVar7 = sVar3 - 0x2ed;
            }
            else {
              uVar7 = sVar3 - 0x6ec;
            }
            if (local_e8.m_capacity <= local_e8.m_size) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)&local_e8,local_e8.m_size + 1,true,2,(object_mover)0x0,
                         false);
            }
            local_e8.m_p[local_e8.m_size] = uVar7;
            local_e8.m_size = local_e8.m_size + 1;
          }
        }
        if (uVar16 != 0xff) {
          uVar15 = uVar16;
          if (local_e8.m_capacity <= local_e8.m_size) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&local_e8,local_e8.m_size + 1,true,2,(object_mover)0x0,
                       false);
          }
          goto LAB_0019ac8d;
        }
        uVar15 = 0xff;
      }
      uVar13 = 0;
      uVar6 = 0;
    }
LAB_0019aca1:
    uVar14 = uVar14 + 1;
  } while (uVar14 <= (uint)local_c8);
  local_68[0x10] = 0;
  local_68[0x11] = 0;
  local_68[0x12] = 0;
  local_68[0x13] = 0;
  local_68[0x14] = 0;
  local_68[8] = 0;
  local_68[9] = 0;
  local_68[10] = 0;
  local_68[0xb] = 0;
  local_68[0xc] = 0;
  local_68[0xd] = 0;
  local_68[0xe] = 0;
  local_68[0xf] = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_68[4] = 0;
  local_68[5] = 0;
  local_68[6] = 0;
  local_68[7] = 0;
  if ((ulong)local_e8.m_size != 0) {
    uVar9 = 0;
    do {
      local_68[(byte)local_e8.m_p[uVar9]] = local_68[(byte)local_e8.m_p[uVar9]] + 1;
      uVar9 = uVar9 + 1;
    } while (local_e8.m_size != uVar9);
  }
  local_a0.m_total_syms = 0;
  local_a0.m_codes.m_p = (unsigned_short *)0x0;
  local_a0.m_codes.m_size = 0;
  local_a0.m_codes.m_capacity = 0;
  local_a0.m_code_sizes.m_p = (uchar *)0x0;
  local_a0.m_code_sizes.m_size._0_1_ = 0;
  local_a0.m_code_sizes._9_7_ = 0;
  local_a0.m_pDecode_tables._0_1_ = 0;
  local_a0._41_8_ = 0;
  iVar4 = static_huffman_data_model::init(&local_a0,(EVP_PKEY_CTX *)0x1);
  this_00 = local_c0;
  uVar17 = 0;
  if ((char)iVar4 != '\0') {
    uVar15 = 0x16;
    uVar9 = 0x14;
    do {
      if (uVar9 == 0xffffffffffffffff) {
        uVar15 = 0;
        break;
      }
      uVar11 = uVar9 & 0xffffffff;
      uVar15 = uVar15 - 1;
      uVar9 = uVar9 - 1;
    } while (local_a0.m_code_sizes.m_p[(byte)(&g_most_probable_codelength_codes)[uVar11]] == '\0');
    if ((char)local_cc == '\0') {
      record_put_bits(local_c0,(uint)local_c8,0xe);
      record_put_bits(this_00,uVar15,5);
      if (uVar15 != 0) {
        uVar9 = 0;
        do {
          record_put_bits(this_00,(uint)local_a0.m_code_sizes.m_p
                                        [(byte)(&g_most_probable_codelength_codes)[uVar9]],3);
          uVar9 = uVar9 + 1;
        } while (uVar15 != uVar9);
      }
    }
    uVar17 = uVar15 * 3 + 0x13;
    if (local_e8.m_size != 0) {
      uVar9 = 0;
      do {
        uVar2 = local_e8.m_p[uVar9];
        uVar11 = (ulong)uVar2 & 0xff;
        bVar12 = (char)uVar2 - 0x11;
        if (bVar12 < 4) {
          num_bits = *(uint *)(&DAT_001b44f0 + (ulong)bVar12 * 4);
          bVar1 = local_a0.m_code_sizes.m_p[uVar11];
          uVar17 = uVar17 + bVar1;
          if ((char)local_cc == '\0') goto LAB_0019aef3;
LAB_0019af1f:
          uVar17 = uVar17 + num_bits;
        }
        else {
          bVar1 = local_a0.m_code_sizes.m_p[uVar11];
          uVar17 = uVar17 + bVar1;
          num_bits = 0;
          if ((char)local_cc == '\0') {
LAB_0019aef3:
            record_put_bits(local_c0,(uint)local_a0.m_codes.m_p[uVar11],(uint)bVar1);
            if (bVar12 < 4) {
              encode_bits(local_c0,(uint)(uVar2 >> 8),num_bits);
              goto LAB_0019af1f;
            }
          }
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < local_e8.m_size);
    }
  }
  static_huffman_data_model::~static_huffman_data_model(&local_a0);
  if ((byte *)local_b8.m_p != (byte *)0x0) {
    crnlib_free(local_b8.m_p);
  }
LAB_0019af4b:
  if (local_e8.m_p != (unsigned_short *)0x0) {
    crnlib_free(local_e8.m_p);
  }
  return uVar17;
}

Assistant:

uint symbol_codec::encode_transmit_static_huffman_data_model(static_huffman_data_model& model, bool simulate = false, static_huffman_data_model* pDeltaModel)
    {
        CRNLIB_ASSERT(m_mode == cEncoding);

        uint total_used_syms = 0;
        for (uint i = model.m_total_syms; i > 0; i--)
        {
            if (model.m_code_sizes[i - 1])
            {
                total_used_syms = i;
                break;
            }
        }

        if (!total_used_syms)
        {
            if (!simulate)
            {
                encode_bits(0, math::total_bits(prefix_coding::cMaxSupportedSyms));
            }

            return math::total_bits(prefix_coding::cMaxSupportedSyms);
        }

        crnlib::vector<uint16> codes;
        codes.reserve(model.m_total_syms);

        uint prev_len = UINT_MAX;
        uint cur_zero_run_size = 0;
        uint cur_nonzero_run_size = 0;

        const uint8* pCodesizes = &model.m_code_sizes[0];

        crnlib::vector<uint8> delta_code_sizes;
        if ((pDeltaModel) && (pDeltaModel->get_total_syms()))
        {
            if (pDeltaModel->m_code_sizes.size() < total_used_syms)
            {
                return 0;
            }

            delta_code_sizes.resize(total_used_syms);
            for (uint i = 0; i < total_used_syms; i++)
            {
                int delta = (int)model.m_code_sizes[i] - (int)pDeltaModel->m_code_sizes[i];
                if (delta < 0)
                {
                    delta += 17;
                }
                delta_code_sizes[i] = static_cast<uint8>(delta);
            }

            pCodesizes = delta_code_sizes.get_ptr();
        }

        for (uint i = 0; i <= total_used_syms; i++)
        {
            const uint len = (i < total_used_syms) ? *pCodesizes++ : 0xFF;
            CRNLIB_ASSERT((len == 0xFF) || (len <= prefix_coding::cMaxExpectedCodeSize));

            if (!len)
            {
                end_nonzero_run(cur_nonzero_run_size, prev_len, codes);

                if (++cur_zero_run_size == cMaxLargeZeroRunSize)
                {
                    end_zero_run(cur_zero_run_size, codes);
                }
            }
            else
            {
                end_zero_run(cur_zero_run_size, codes);

                if (len != prev_len)
                {
                    end_nonzero_run(cur_nonzero_run_size, prev_len, codes);

                    if (len != 0xFF)
                    {
                        codes.push_back(static_cast<uint16>(len));
                    }
                }
                else if (++cur_nonzero_run_size == cLargeMaxNonZeroRunSize)
                {
                    end_nonzero_run(cur_nonzero_run_size, prev_len, codes);
                }
            }

            prev_len = len;
        }

        uint16 hist[cMaxCodelengthCodes];
        utils::zero_object(hist);

        for (uint i = 0; i < codes.size(); i++)
        {
            uint code = codes[i] & 0xFF;
            CRNLIB_ASSERT(code < cMaxCodelengthCodes);
            hist[code] = static_cast<uint16>(hist[code] + 1);
        }

        static_huffman_data_model dm;
        if (!dm.init(true, cMaxCodelengthCodes, hist, 7))
        {
            return 0;
        }

        uint num_codelength_codes_to_send;
        for (num_codelength_codes_to_send = cNumMostProbableCodelengthCodes; num_codelength_codes_to_send > 0; num_codelength_codes_to_send--)
        {
            if (dm.get_cost(g_most_probable_codelength_codes[num_codelength_codes_to_send - 1]))
            {
                break;
            }
        }

        uint total_bits = math::total_bits(prefix_coding::cMaxSupportedSyms);
        total_bits += 5;
        total_bits += 3 * num_codelength_codes_to_send;

        if (!simulate)
        {
            encode_bits(total_used_syms, math::total_bits(prefix_coding::cMaxSupportedSyms));

            encode_bits(num_codelength_codes_to_send, 5);
            for (uint i = 0; i < num_codelength_codes_to_send; i++)
            {
                encode_bits(dm.get_cost(g_most_probable_codelength_codes[i]), 3);
            }
        }

        for (uint i = 0; i < codes.size(); i++)
        {
            uint code = codes[i];
            uint extra = code >> 8;
            code &= 0xFF;

            uint extra_bits = 0;
            if (code == cSmallZeroRunCode)
            {
                extra_bits = cSmallZeroRunExtraBits;
            }
            else if (code == cLargeZeroRunCode)
            {
                extra_bits = cLargeZeroRunExtraBits;
            }
            else if (code == cSmallRepeatCode)
            {
                extra_bits = cSmallNonZeroRunExtraBits;
            }
            else if (code == cLargeRepeatCode)
            {
                extra_bits = cLargeNonZeroRunExtraBits;
            }

            total_bits += dm.get_cost(code);

            if (!simulate)
            {
                encode(code, dm);
            }

            if (extra_bits)
            {
                if (!simulate)
                {
                    encode_bits(extra, extra_bits);
                }

                total_bits += extra_bits;
            }
        }

        return total_bits;
    }